

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseVertex
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,Vertex *vertex,bool bVASection)

{
  bool bVar1;
  ulong uVar2;
  Assimp *pAVar3;
  undefined1 check_comma;
  uint uVar4;
  ulong __new_size;
  pointer ppVar5;
  Assimp *local_40;
  value_type local_38;
  uint *out;
  
  for (; ((Assimp)*szCurrent == (Assimp)0x20 || ((Assimp)*szCurrent == (Assimp)0x9));
      szCurrent = (char *)((Assimp *)szCurrent + 1)) {
  }
  out = &vertex->iParentNode;
  local_40 = (Assimp *)szCurrent;
  bVar1 = ParseSignedInt(this,szCurrent,(char **)&local_40,(int *)out);
  check_comma = SUB81(out,0);
  pAVar3 = local_40;
  if (bVar1) {
    for (; uVar2 = (ulong)(byte)*pAVar3, uVar2 < 0x21; pAVar3 = pAVar3 + 1) {
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        check_comma = true;
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.x");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)vertex,(float *)0x1,(bool)check_comma);
    pAVar3 = local_40;
    while( true ) {
      uVar2 = (ulong)(byte)*pAVar3;
      if (0x20 < uVar2) break;
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.y");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
      pAVar3 = pAVar3 + 1;
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&(vertex->pos).y,(float *)0x1,(bool)*pAVar3);
    pAVar3 = local_40;
    while( true ) {
      uVar2 = (ulong)(byte)*pAVar3;
      if (0x20 < uVar2) break;
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.z");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
      pAVar3 = pAVar3 + 1;
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&(vertex->pos).z,(float *)0x1,(bool)*pAVar3);
    pAVar3 = local_40;
    while( true ) {
      uVar2 = (ulong)(byte)*pAVar3;
      if (0x20 < uVar2) break;
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.x");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
      pAVar3 = pAVar3 + 1;
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&vertex->nor,(float *)0x1,(bool)*pAVar3);
    pAVar3 = local_40;
    while( true ) {
      uVar2 = (ulong)(byte)*pAVar3;
      if (0x20 < uVar2) break;
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.y");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
      pAVar3 = pAVar3 + 1;
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&(vertex->nor).y,(float *)0x1,(bool)*pAVar3);
    pAVar3 = local_40;
    while( true ) {
      uVar2 = (ulong)(byte)*pAVar3;
      if (0x20 < uVar2) break;
      if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.z");
          while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
            local_40 = local_40 + 1;
          }
          for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1)
          {
          }
          goto LAB_00627764;
        }
        break;
      }
      pAVar3 = pAVar3 + 1;
    }
    local_40 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&(vertex->nor).z,(float *)0x1,(bool)*pAVar3);
    if (bVASection) {
      while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
        local_40 = local_40 + 1;
      }
      for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
      }
    }
    else {
      pAVar3 = local_40;
      while( true ) {
        uVar2 = (ulong)(byte)*pAVar3;
        if (0x20 < uVar2) break;
        if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.x");
            while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
              local_40 = local_40 + 1;
            }
            for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1
                ) {
            }
            goto LAB_00627764;
          }
          break;
        }
        pAVar3 = pAVar3 + 1;
      }
      local_40 = (Assimp *)
                 fast_atoreal_move<float>(pAVar3,(char *)&vertex->uv,(float *)0x1,(bool)*pAVar3);
      pAVar3 = local_40;
      while( true ) {
        uVar2 = (ulong)(byte)*pAVar3;
        if (0x20 < uVar2) break;
        if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.y");
            while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
              local_40 = local_40 + 1;
            }
            for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1
                ) {
            }
            goto LAB_00627764;
          }
          break;
        }
        pAVar3 = pAVar3 + 1;
      }
      pAVar3 = (Assimp *)
               fast_atoreal_move<float>(pAVar3,(char *)&(vertex->uv).y,(float *)0x1,(bool)*pAVar3);
      local_40 = pAVar3;
      while( true ) {
        uVar2 = (ulong)(byte)*local_40;
        if (0x20 < uVar2) break;
        if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) {
            bVar1 = false;
            goto LAB_00627b21;
          }
          break;
        }
        local_40 = local_40 + 1;
      }
      bVar1 = true;
LAB_00627b21:
      if (bVar1) {
        __new_size = 0;
        if (0xf5 < (byte)((char)*local_40 - 0x3aU)) {
          do {
            uVar4 = (uint)(byte)((char)uVar2 - 0x30) + (int)__new_size * 10;
            __new_size = (ulong)uVar4;
            pAVar3 = local_40 + 1;
            uVar2 = (ulong)(byte)*pAVar3;
            local_40 = local_40 + 1;
          } while (0xf5 < (byte)((char)*pAVar3 - 0x3aU));
          __new_size = (ulong)uVar4;
        }
      }
      else {
        __new_size = 0;
        local_40 = pAVar3;
      }
      if (bVar1) {
        local_38.first = 0;
        local_38.second = 0.0;
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        resize(&vertex->aiBoneLinks,__new_size,&local_38);
        ppVar5 = (vertex->aiBoneLinks).
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pAVar3 = local_40;
        if (ppVar5 != (vertex->aiBoneLinks).
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00627b8b:
          do {
            uVar2 = (ulong)(byte)*pAVar3;
            if (uVar2 < 0x21) {
              if ((0x100000200U >> (uVar2 & 0x3f) & 1) != 0) {
                pAVar3 = pAVar3 + 1;
                goto LAB_00627b8b;
              }
              if ((0x3401UL >> (uVar2 & 0x3f) & 1) == 0) goto LAB_00627ba9;
              bVar1 = false;
            }
            else {
LAB_00627ba9:
              bVar1 = true;
            }
            if (bVar1 == false) goto LAB_00627cd0;
            uVar4 = 0;
            local_40 = pAVar3;
            if (0xf5 < (byte)((char)*pAVar3 - 0x3aU)) {
              uVar4 = 0;
              do {
                uVar4 = (uint)(byte)((char)uVar2 - 0x30) + uVar4 * 10;
                pAVar3 = local_40 + 1;
                uVar2 = (ulong)(byte)*pAVar3;
                local_40 = local_40 + 1;
              } while (0xf5 < (byte)((char)*pAVar3 - 0x3aU));
            }
            ppVar5->first = uVar4;
            if (bVar1 == false) goto LAB_00627cd0;
            for (pAVar3 = local_40; uVar2 = (ulong)(byte)*pAVar3, uVar2 < 0x21; pAVar3 = pAVar3 + 1)
            {
              if ((0x100000200U >> (uVar2 & 0x3f) & 1) == 0) {
                if ((0x3401UL >> (uVar2 & 0x3f) & 1) != 0) goto LAB_00627c98;
                break;
              }
            }
            local_40 = (Assimp *)
                       fast_atoreal_move<float>(pAVar3,(char *)&ppVar5->second,(float *)0x1,bVar1);
            ppVar5 = ppVar5 + 1;
            pAVar3 = local_40;
          } while (ppVar5 != (vertex->aiBoneLinks).
                             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
          local_40 = local_40 + 1;
        }
        for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
        }
      }
      else {
        while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
          local_40 = local_40 + 1;
        }
        for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
        }
      }
    }
  }
  else {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.parent");
    while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
      local_40 = local_40 + 1;
    }
    for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
    }
  }
LAB_00627764:
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = (char *)local_40;
  return;
LAB_00627cd0:
  while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
    local_40 = local_40 + 1;
  }
  for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
  }
  goto LAB_00627764;
LAB_00627c98:
  while ((0xd < (byte)*local_40 || ((0x2401U >> ((byte)*local_40 & 0x1f) & 1) == 0))) {
    local_40 = local_40 + 1;
  }
  for (; (*local_40 == (Assimp)0xd || (*local_40 == (Assimp)0xa)); local_40 = local_40 + 1) {
  }
  goto LAB_00627764;
}

Assistant:

void SMDImporter::ParseVertex(const char* szCurrent,
        const char** szCurrentOut, SMD::Vertex& vertex,
        bool bVASection /*= false*/) {
    if (SkipSpaces(&szCurrent) && IsLineEnd(*szCurrent)) {
        SkipSpacesAndLineEnd(szCurrent,&szCurrent);
        return ParseVertex(szCurrent,szCurrentOut,vertex,bVASection);
    }
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)vertex.iParentNode)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.parent");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.z");
        SMDI_PARSE_RETURN;
    }

    if (bVASection) {
        SMDI_PARSE_RETURN;
    }

    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.y");
        SMDI_PARSE_RETURN;
    }

    // now read the number of bones affecting this vertex
    // all elements from now are fully optional, we don't need them
    unsigned int iSize = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iSize)) {
        SMDI_PARSE_RETURN;
    }
    vertex.aiBoneLinks.resize(iSize,std::pair<unsigned int, float>(0,0.0f));

    for (std::vector<std::pair<unsigned int, float> >::iterator
            i =  vertex.aiBoneLinks.begin();
            i != vertex.aiBoneLinks.end();++i) {
        if(!ParseUnsignedInt(szCurrent,&szCurrent,(*i).first)) {
            SMDI_PARSE_RETURN;
        }
        if(!ParseFloat(szCurrent,&szCurrent,(*i).second)) {
            SMDI_PARSE_RETURN;
        }
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}